

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O2

void __thiscall
TPZMatrixSolver<float>::TPZMatrixSolver
          (TPZMatrixSolver<float> *this,void **vtt,TPZAutoPointer<TPZMatrix<float>_> *Refmat)

{
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&this->fReferenceMatrix);
  TPZFMatrix<float>::TPZFMatrix(&this->fScratch);
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&this->fContainer);
  TPZAutoPointer<TPZMatrix<float>_>::operator=(&this->fContainer,Refmat);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(TPZAutoPointer<TPZMatrix<TVar> > Refmat) :
fScratch()
{
	fContainer = Refmat;
}